

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deserializer.cpp
# Opt level: O3

void __thiscall
Deserializer_BigEndian_Test::~Deserializer_BigEndian_Test(Deserializer_BigEndian_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Deserializer, BigEndian) {
  Deserializer parser(ByteData("010203040506070808090a0b0c0d0e0f"));
  Deserializer parser2(parser);
  EXPECT_FALSE(parser2.HasEof());

  EXPECT_EQ(1, parser.ReadUint8());
  auto buf = parser.ReadBuffer(2);
  EXPECT_EQ("0203", ByteData(buf).GetHex());
  EXPECT_EQ(0x04050607, parser.ReadUint32FromBigEndian());
  EXPECT_EQ(7, parser.GetReadSize());
  EXPECT_FALSE(parser.HasEof());
  EXPECT_STREQ("08090a0b0c0d0e0f",
      parser.ReadVariableData().GetHex().c_str());
  EXPECT_EQ(16, parser.GetReadSize());
  EXPECT_TRUE(parser.HasEof());
}